

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzblockdiag.cpp
# Opt level: O2

void __thiscall
TPZBlockDiagonal<std::complex<float>_>::Initialize
          (TPZBlockDiagonal<std::complex<float>_> *this,TPZVec<int> *blocksize)

{
  int iVar1;
  int *piVar2;
  long *plVar3;
  long lVar4;
  long lVar5;
  long newsize;
  long lVar6;
  complex<float> local_30;
  
  lVar6 = blocksize->fNElements;
  TPZVec<int>::operator=(&this->fBlockSize,blocksize);
  local_30._M_value = 0;
  TPZVec<long>::Resize(&this->fBlockPos,lVar6 + 1,(long *)&local_30);
  piVar2 = blocksize->fStore;
  plVar3 = (this->fBlockPos).fStore;
  newsize = 0;
  if (lVar6 < 1) {
    lVar6 = newsize;
  }
  lVar5 = 0;
  for (lVar4 = 0; lVar6 != lVar4; lVar4 = lVar4 + 1) {
    iVar1 = piVar2[lVar4];
    lVar5 = lVar5 + iVar1;
    newsize = newsize + (ulong)(uint)(iVar1 * iVar1);
    plVar3[lVar4 + 1] = (ulong)(uint)(iVar1 * iVar1) + plVar3[lVar4];
  }
  local_30._M_value = 0;
  TPZVec<std::complex<float>_>::Fill(&this->fStorage,&local_30,0,-1);
  local_30._M_value = 0;
  TPZVec<std::complex<float>_>::Resize(&this->fStorage,newsize,&local_30);
  (this->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fDecomposed = '\0';
  (this->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fRow = lVar5;
  (this->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fCol = lVar5;
  return;
}

Assistant:

void TPZBlockDiagonal<TVar>::Initialize(const TPZVec<int> &blocksize){
	int64_t nblock = blocksize.NElements();
#ifdef PZ_LOG
    if (logger.isDebugEnabled())
	{
		std::stringstream sout;
		sout << "Number of blocks \t" << nblock;
		LOGPZ_DEBUG(logger,sout.str());
	}
#endif
	fBlockSize = blocksize;
	fBlockPos.Resize(nblock+1,0); 
	int64_t b;
	int64_t ndata = 0;
	int64_t neq = 0;
	int bsize;
	for(b=0; b<nblock; b++) {
		bsize = blocksize[b];
		fBlockPos[b+1] = fBlockPos[b]+bsize*bsize;
		ndata += bsize*bsize;
		neq += bsize;
	}
#ifdef PZ_LOG
	if(ndata > 10000000)
	{
		std::stringstream sout;
		sout << "Calling fStorage.Resize(ndata,0.) with ndata = " << ndata;
		LOGPZ_DEBUG(logger,sout.str());
	}
#endif
	
	fStorage.Fill(0.,0);
	fStorage.Resize(ndata,0.);
	this->fDecomposed = 0;
	this->fRow = neq;
	this->fCol = neq;
}